

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validExrFile.cpp
# Opt level: O1

bool isComplete(char *fileName)

{
  undefined1 uVar1;
  int iVar2;
  InputFile in;
  InputFile local_30 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  iVar2 = Imf_3_4::globalThreadCount();
  Imf_3_4::InputFile::InputFile(local_30,fileName,iVar2);
  uVar1 = Imf_3_4::InputFile::isComplete();
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  return (bool)uVar1;
}

Assistant:

bool
isComplete (const char fileName[])
{
    InputFile in (fileName);
    return in.isComplete();
}